

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase436::run(TestCase436 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  undefined8 uVar3;
  void *pvVar4;
  TransformPromiseNodeBase *pTVar5;
  int counter;
  DebugComparison<int,_int_&> _kjCondition;
  WaitScope waitScope;
  ErrorHandlerImpl errorHandler;
  TaskSet tasks;
  EventLoop loop;
  undefined1 local_17c [4];
  OwnPromiseNode local_178;
  OwnPromiseNode local_170;
  OwnPromiseNode local_168;
  undefined1 local_160 [40];
  EventLoop *local_138;
  uint local_130;
  long local_128;
  byte abStack_120 [8];
  char *local_118;
  char *pcStack_110;
  byte local_108 [8];
  char *local_100;
  char *pcStack_f8;
  byte local_f0 [8];
  ErrorHandler local_e8;
  TaskSet local_e0;
  EventLoop local_a8;
  
  EventLoop::EventLoop(&local_a8);
  local_130 = 0xffffffff;
  local_128 = 0;
  abStack_120[0] = '\0';
  abStack_120[1] = '\0';
  abStack_120[2] = '\0';
  abStack_120[3] = '\0';
  abStack_120[4] = '\0';
  abStack_120[5] = '\0';
  abStack_120[6] = '\0';
  abStack_120[7] = '\0';
  local_138 = &local_a8;
  EventLoop::enterScope(&local_a8);
  local_17c = (undefined1  [4])0x0;
  local_e8._vptr_ErrorHandler = (_func_int **)&PTR_Exception____00601b28;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_f8 = "run";
  local_f0[0] = 0xc1;
  local_f0[1] = '\x01';
  local_f0[2] = '\0';
  local_f0[3] = '\0';
  local_f0[4] = '\x0f';
  local_f0[5] = '\0';
  local_f0[6] = '\0';
  local_f0[7] = '\0';
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x1c1;
  location.columnNumber = 0xf;
  TaskSet::TaskSet(&local_e0,&local_e8,location);
  yield();
  uVar3 = local_160._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_160._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_160._0_8_ - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    pTVar5 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,(OwnPromiseNode *)local_160,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:451:23)>
               ::anon_class_16_2_219bd73b_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_00601e70;
    *(undefined1 **)((long)pvVar4 + 0x3f0) = local_17c;
    *(TaskSet **)((long)pvVar4 + 0x3f8) = &local_e0;
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    ((PromiseArenaMember *)local_160._0_8_)->arena = (PromiseArena *)0x0;
    pTVar5 = (TransformPromiseNodeBase *)(local_160._0_8_ + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,(OwnPromiseNode *)local_160,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:451:23)>
               ::anon_class_16_2_219bd73b_for_func::operator());
    ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_00601e70;
    ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)local_17c;
    ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)&local_e0;
    ((PromiseArenaMember *)(uVar3 + -0x30))->arena = pPVar1;
  }
  uVar3 = local_160._0_8_;
  local_178.ptr = &pTVar5->super_PromiseNode;
  if ((PromiseArenaMember *)local_160._0_8_ != (PromiseArenaMember *)0x0) {
    local_160._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  TaskSet::add(&local_e0,(Promise<void> *)&local_178);
  OVar2.ptr = local_178.ptr;
  if ((TransformPromiseNodeBase *)local_178.ptr != (TransformPromiseNodeBase *)0x0) {
    local_178.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  yield();
  OVar2.ptr = local_170.ptr;
  pPVar1 = ((local_170.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_170.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    pTVar5 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,&local_170,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:498:23)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_00601ec8;
    *(undefined1 **)((long)pvVar4 + 0x3f8) = local_17c;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_170.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar5 = (TransformPromiseNodeBase *)&local_170.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar5,&local_170,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:498:23)>
               ::anon_class_8_1_bc7188dc_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00601ec8;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_17c;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_160._0_8_ = &DAT_0048a171;
  local_160._8_8_ = &DAT_0048a1d0;
  local_160._16_8_ = &DAT_4c0000058b;
  local_178.ptr = &pTVar5->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_168,&local_178,(SourceLocation *)local_160);
  OVar2.ptr = local_178.ptr;
  if ((TransformPromiseNodeBase *)local_178.ptr != (TransformPromiseNodeBase *)0x0) {
    local_178.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_170.ptr;
  if (&(local_170.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_170.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  TaskSet::add(&local_e0,(Promise<void> *)&local_168);
  OVar2.ptr = local_168.ptr;
  if (&(local_168.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_168.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  TaskSet::onEmpty((TaskSet *)local_160);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_110 = "run";
  local_108[0] = 0xfa;
  local_108[1] = '\x01';
  local_108[2] = '\0';
  local_108[3] = '\0';
  local_108[4] = '\x03';
  local_108[5] = '\0';
  local_108[6] = '\0';
  local_108[7] = '\0';
  Promise<void>::wait((Promise<void> *)local_160,&local_138);
  uVar3 = local_160._0_8_;
  if ((PromiseArenaMember *)local_160._0_8_ != (PromiseArenaMember *)0x0) {
    local_160._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  local_160._8_8_ = local_17c;
  local_160[0x20] = local_17c == (undefined1  [4])0xb;
  local_160._0_4_ = 0xb;
  local_160._16_8_ = " == ";
  local_160._24_8_ = &DAT_00000005;
  if ((!local_160[0x20]) && (kj::_::Debug::minSeverity < 3)) {
    local_178.ptr._0_4_ = 0xb;
    kj::_::Debug::log<char_const(&)[35],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1fc,ERROR,"\"failed: expected \" \"(11) == (counter)\", _kjCondition, 11, counter"
               ,(char (*) [35])"failed: expected (11) == (counter)",
               (DebugComparison<int,_int_&> *)local_160,(int *)&local_178,(int *)local_160._8_8_);
  }
  TaskSet::~TaskSet(&local_e0);
  if (local_128 == 0) {
    EventLoop::leaveScope(local_138);
  }
  EventLoop::~EventLoop(&local_a8);
  return;
}

Assistant:

TEST(Async, Ordering) {
  EventLoop loop;
  WaitScope waitScope(loop);

  class ErrorHandlerImpl: public TaskSet::ErrorHandler {
  public:
    void taskFailed(kj::Exception&& exception) override {
      KJ_FAIL_EXPECT(exception);
    }
  };

  int counter = 0;
  ErrorHandlerImpl errorHandler;
  kj::TaskSet tasks(errorHandler);

  tasks.add(evalLater([&]() {
    EXPECT_EQ(0, counter++);

    {
      // Use a promise and fulfiller so that we can fulfill the promise after waiting on it in
      // order to induce depth-first scheduling.
      auto paf = kj::newPromiseAndFulfiller<void>();
      tasks.add(paf.promise.then([&]() {
        EXPECT_EQ(1, counter++);
      }));
      paf.fulfiller->fulfill();
    }

    // .then() is scheduled breadth-first if the promise has already resolved, but depth-first
    // if the promise resolves later.
    tasks.add(Promise<void>(READY_NOW).then([&]() {
      EXPECT_EQ(4, counter++);
    }).then([&]() {
      EXPECT_EQ(5, counter++);
      tasks.add(kj::evalLast([&]() {
        EXPECT_EQ(7, counter++);
        tasks.add(kj::evalLater([&]() {
          EXPECT_EQ(8, counter++);
        }));
      }));
    }));

    {
      auto paf = kj::newPromiseAndFulfiller<void>();
      tasks.add(paf.promise.then([&]() {
        EXPECT_EQ(2, counter++);
        tasks.add(kj::evalLast([&]() {
          EXPECT_EQ(9, counter++);
          tasks.add(kj::evalLater([&]() {
            EXPECT_EQ(10, counter++);
          }));
        }));
      }));
      paf.fulfiller->fulfill();
    }

    // evalLater() is like READY_NOW.then().
    tasks.add(evalLater([&]() {
      EXPECT_EQ(6, counter++);
    }));
  }));

  tasks.add(evalLater([&]() {
    EXPECT_EQ(3, counter++);

    // Making this a chain should NOT cause it to preempt the first promise.  (This was a problem
    // at one point.)
    return Promise<void>(READY_NOW);
  }));

  tasks.onEmpty().wait(waitScope);

  EXPECT_EQ(11, counter);
}